

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::TranslatePath(ClipperLib *this,Path *input,Path *output,IntPoint delta)

{
  long lVar1;
  long lVar2;
  pointer pIVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::resize
            (input,*(long *)(this + 8) - *(long *)this >> 4);
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  pIVar3 = (input->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = 8;
  for (uVar6 = 0; uVar6 < (ulong)(lVar2 - lVar1 >> 4); uVar6 = uVar6 + 1) {
    lVar4 = *(long *)(lVar1 + lVar5);
    *(long *)((long)pIVar3 + lVar5 + -8) =
         (long)&(output->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_start + *(long *)(lVar1 + -8 + lVar5);
    *(long *)((long)&pIVar3->X + lVar5) = lVar4 + delta.X;
    lVar5 = lVar5 + 0x10;
  }
  return;
}

Assistant:

void TranslatePath(const Path& input, Path& output, const IntPoint delta)
{
  //precondition: input != output
  output.resize(input.size());
  for (size_t i = 0; i < input.size(); ++i)
    output[i] = IntPoint(input[i].X + delta.X, input[i].Y + delta.Y);
}